

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GdlFeatures.h
# Opt level: O2

void __thiscall GdlLanguageDefn::SetCode(GdlLanguageDefn *this,string *staCode)

{
  string asStack_38 [32];
  
  std::__cxx11::string::substr((ulong)asStack_38,(ulong)staCode);
  std::__cxx11::string::operator=((string *)staCode,asStack_38);
  std::__cxx11::string::~string(asStack_38);
  this->m_rgchID[0] = '\0';
  this->m_rgchID[1] = '\0';
  this->m_rgchID[2] = '\0';
  this->m_rgchID[3] = '\0';
  memcpy(this->m_rgchID,(staCode->_M_dataplus)._M_p,staCode->_M_string_length);
  return;
}

Assistant:

void SetCode(std::string staCode)
	{
		Assert(staCode.length() <= 4);
		staCode = staCode.substr(0, 4);
		memset(m_rgchID, 0, sizeof(m_rgchID));
		memcpy(m_rgchID, staCode.data(), staCode.size() * sizeof(char));
	}